

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_entropy_adjoint(REF_DBL *primitive,REF_DBL *dual)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double __x;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  dVar1 = primitive[2];
  dVar2 = primitive[3];
  dVar3 = primitive[4];
  __x = *primitive;
  dVar5 = primitive[1];
  dVar6 = pow(__x,1.4);
  dVar6 = log(dVar3 / dVar6);
  *dual = (__x * -0.5 * (dVar2 * dVar2 + dVar5 * dVar5 + dVar1 * dVar1)) / dVar3 +
          (1.4 - dVar6) / 0.3999999999999999;
  auVar7._0_8_ = __x * dVar5;
  auVar7._8_8_ = dVar1 * __x;
  auVar8._8_8_ = dVar3;
  auVar8._0_8_ = dVar3;
  auVar8 = divpd(auVar7,auVar8);
  *(undefined1 (*) [16])(dual + 1) = auVar8;
  auVar9._8_8_ = -__x;
  auVar9._0_8_ = __x * dVar2;
  auVar4._8_8_ = dVar3;
  auVar4._0_8_ = dVar3;
  auVar8 = divpd(auVar9,auVar4);
  *(undefined1 (*) [16])(dual + 3) = auVar8;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_entropy_adjoint(REF_DBL *primitive, REF_DBL *dual) {
  REF_DBL rho, u, v, w, p, s, vel2;
  REF_DBL gamma = 1.4;
  rho = primitive[0];
  u = primitive[1];
  v = primitive[2];
  w = primitive[3];
  p = primitive[4];
  /* entropy adjoint, Equ. (11), AIAA 2009-3790 */
  s = log(p / pow(rho, gamma));
  vel2 = u * u + v * v + w * w;
  dual[0] = (gamma - s) / (gamma - 1.0) - 0.5 * rho * vel2 / p;
  dual[1] = rho * u / p;
  dual[2] = rho * v / p;
  dual[3] = rho * w / p;
  dual[4] = -rho / p;

  return REF_SUCCESS;
}